

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void aom_paeth_predictor_16x8_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  ulong uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  ushort uVar4;
  ulong *in_RCX;
  __m256i *in_RDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  __m128i row;
  __m256i l16;
  int i;
  __m256i top;
  __m256i one;
  __m256i rep;
  __m256i tl16;
  __m256i l;
  __m128i x;
  undefined8 local_330;
  undefined8 uStackY_328;
  int local_2e4;
  __m256i *left_00;
  undefined8 uStack_2c8;
  undefined1 local_2a0 [32];
  uint8_t *local_208;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  uVar1 = *in_RCX;
  uVar4 = (ushort)*(byte *)((long)in_RDX[-1] + 0x1f);
  auVar6 = vpinsrw_avx(ZEXT216(uVar4),(uint)uVar4,1);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar4,2);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar4,3);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar4,4);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar4,5);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar4,6);
  vpinsrw_avx(auVar6,(uint)uVar4,7);
  auVar6 = vpinsrw_avx(ZEXT216(uVar4),(uint)uVar4,1);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar4,2);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar4,3);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar4,4);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar4,5);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar4,6);
  vpinsrw_avx(auVar6,(uint)uVar4,7);
  auVar6 = vpinsrw_avx(ZEXT216(0x8000),0x8000,1);
  auVar6 = vpinsrw_avx(auVar6,0x8000,2);
  auVar6 = vpinsrw_avx(auVar6,0x8000,3);
  auVar6 = vpinsrw_avx(auVar6,0x8000,4);
  auVar6 = vpinsrw_avx(auVar6,0x8000,5);
  auVar6 = vpinsrw_avx(auVar6,0x8000,6);
  local_2a0._0_16_ = vpinsrw_avx(auVar6,0x8000,7);
  auVar6 = vpinsrw_avx(ZEXT216(0x8000),0x8000,1);
  auVar6 = vpinsrw_avx(auVar6,0x8000,2);
  auVar6 = vpinsrw_avx(auVar6,0x8000,3);
  auVar6 = vpinsrw_avx(auVar6,0x8000,4);
  auVar6 = vpinsrw_avx(auVar6,0x8000,5);
  auVar6 = vpinsrw_avx(auVar6,0x8000,6);
  auVar6 = vpinsrw_avx(auVar6,0x8000,7);
  uStack_b0 = auVar6._0_8_;
  uStack_a8 = auVar6._8_8_;
  local_2a0._16_8_ = uStack_b0;
  local_2a0._24_8_ = uStack_a8;
  auVar6 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar6 = vpinsrw_avx(auVar6,1,2);
  auVar6 = vpinsrw_avx(auVar6,1,3);
  auVar6 = vpinsrw_avx(auVar6,1,4);
  auVar6 = vpinsrw_avx(auVar6,1,5);
  auVar6 = vpinsrw_avx(auVar6,1,6);
  auVar6 = vpinsrw_avx(auVar6,1,7);
  auVar8 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar8 = vpinsrw_avx(auVar8,1,2);
  auVar8 = vpinsrw_avx(auVar8,1,3);
  auVar8 = vpinsrw_avx(auVar8,1,4);
  auVar8 = vpinsrw_avx(auVar8,1,5);
  auVar8 = vpinsrw_avx(auVar8,1,6);
  auVar8 = vpinsrw_avx(auVar8,1,7);
  auVar5 = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar8;
  auVar8 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar6;
  uStack_70 = auVar8._0_8_;
  uStack_68 = auVar8._8_8_;
  auVar6 = auVar5;
  get_top_vector(in_RDX,in_RSI);
  local_208 = in_RDI;
  for (local_2e4 = 0; uStack_2c8 = auVar8._8_8_, left_00 = auVar8._0_8_, local_2e4 < 8;
      local_2e4 = local_2e4 + 1) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar1;
    auVar3._16_8_ = uVar1;
    auVar3._24_8_ = 0;
    auVar2 = vpshufb_avx2(auVar3,local_2a0);
    auVar7 = auVar2._0_16_;
    paeth_16x1_pred(left_00,auVar6._8_8_,auVar6._0_8_);
    auVar8._8_8_ = uStack_2c8;
    auVar8._0_8_ = left_00;
    local_330 = auVar7._0_8_;
    uStackY_328 = auVar7._8_8_;
    *(undefined8 *)local_208 = local_330;
    *(undefined8 *)(local_208 + 8) = uStackY_328;
    local_208 = in_RSI + (long)local_208;
    auVar2._16_8_ = uStack_70;
    auVar2._0_16_ = auVar5;
    auVar2._24_8_ = uStack_68;
    local_2a0 = vpaddw_avx2(local_2a0,auVar2);
  }
  return;
}

Assistant:

void aom_paeth_predictor_16x8_avx2(uint8_t *dst, ptrdiff_t stride,
                                   const uint8_t *above, const uint8_t *left) {
  __m128i x = _mm_loadl_epi64((const __m128i *)left);
  const __m256i l = _mm256_inserti128_si256(_mm256_castsi128_si256(x), x, 1);
  const __m256i tl16 = _mm256_set1_epi16((int16_t)above[-1]);
  __m256i rep = _mm256_set1_epi16((short)0x8000);
  const __m256i one = _mm256_set1_epi16(1);
  const __m256i top = get_top_vector(above);

  int i;
  for (i = 0; i < 8; ++i) {
    const __m256i l16 = _mm256_shuffle_epi8(l, rep);
    const __m128i row = paeth_16x1_pred(&l16, &top, &tl16);

    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    rep = _mm256_add_epi16(rep, one);
  }
}